

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_helicopter::state_read
          (cse_alife_helicopter *this,xr_packet *packet,uint16_t size)

{
  cse_alife_dynamic_object_visual::state_read(&this->super_cse_alife_dynamic_object_visual,packet,0)
  ;
  xr_packet::r_sz(packet,&(this->super_cse_motion).m_motion_name);
  if (0x44 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
             super_cse_alife_object.super_cse_abstract.m_version) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,0);
  }
  xr_packet::r_sz(packet,&(this->super_cse_alife_dynamic_object_visual).super_cse_visual.
                          m_startup_animation);
  xr_packet::r_sz(packet,&this->m_engine_sound);
  return;
}

Assistant:

void cse_alife_helicopter::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	cse_motion::motion_read(packet);
	if (m_version >= CSE_VERSION_0x45)
		cse_ph_skeleton::state_read(packet, size);
	packet.r_sz(cse_visual::m_startup_animation);
	packet.r_sz(m_engine_sound);
}